

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsReceiveQueue.cpp
# Opt level: O2

void __thiscall Scs::ReceiveQueue::Push(ReceiveQueue *this,void *data,size_t bytes)

{
  BufferPtr *this_00;
  element_type *peVar1;
  ulong uVar2;
  size_t sVar3;
  uchar *puVar4;
  const_iterator __position;
  vector<unsigned_char,Scs::Allocator<unsigned_char>> *this_01;
  uchar *puVar5;
  __shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  local_48;
  ulong *local_38;
  
  std::mutex::lock(&this->m_mutex);
  this_00 = &this->m_receiveBuffer;
  local_38 = (ulong *)data;
  do {
    if ((uchar *)bytes == (uchar *)0x0) {
LAB_0010dc4b:
      pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
      return;
    }
    sVar3 = this->m_messageSize;
    if (sVar3 == 0) {
      if (bytes < (uchar *)0x8) {
        __assert_fail("bytes >= sizeof(MessageHeader)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JamesBoer[P]Scs/Source/ScsReceiveQueue.cpp"
                      ,0x31,"void Scs::ReceiveQueue::Push(const void *, size_t)");
      }
      if ((int)*local_38 != 0x6d736373) {
        LogWriteLine("Transmission error.  Magic header mismatch.");
        goto LAB_0010dc4b;
      }
      this->m_messageSize = *local_38 >> 0x20;
      this_01 = (vector<unsigned_char,Scs::Allocator<unsigned_char>> *)
                (this->m_receiveBuffer).
                super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      if (this_01 == (vector<unsigned_char,Scs::Allocator<unsigned_char>> *)0x0) {
        CreateBuffer();
        std::
        __shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ::operator=(&this_00->
                     super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ,&local_48);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
        this_01 = (vector<unsigned_char,Scs::Allocator<unsigned_char>> *)
                  (this_00->
                  super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr;
      }
      puVar5 = *(uchar **)this_01;
      __position._M_current = *(uchar **)(this_01 + 8);
      if (*(uchar **)(this_01 + 8) != puVar5) {
        *(uchar **)(this_01 + 8) = puVar5;
        __position._M_current = puVar5;
      }
      bytes = bytes + -8;
      data = (void *)((long)data + 8);
      sVar3 = this->m_messageSize;
    }
    else {
      this_01 = (vector<unsigned_char,Scs::Allocator<unsigned_char>> *)
                (this_00->
                super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr;
      puVar5 = *(uchar **)this_01;
      __position._M_current = *(uchar **)(this_01 + 8);
    }
    puVar4 = puVar5 + (sVar3 - (long)__position._M_current);
    if (bytes < puVar5 + (sVar3 - (long)__position._M_current)) {
      puVar4 = (uchar *)bytes;
    }
    puVar5 = (uchar *)((long)data + (long)puVar4);
    std::vector<unsigned_char,Scs::Allocator<unsigned_char>>::insert<unsigned_char_const*,void>
              (this_01,__position,(uchar *)data,puVar5);
    bytes = bytes + -(long)puVar4;
    peVar1 = (this->m_receiveBuffer).
             super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    uVar2 = *(long *)&(peVar1->super__Vector_base<unsigned_char,_Scs::Allocator<unsigned_char>_>).
                      _M_impl.field_0x8 -
            *(long *)&(peVar1->super__Vector_base<unsigned_char,_Scs::Allocator<unsigned_char>_>).
                      _M_impl;
    data = puVar5;
    if (this->m_messageSize <= uVar2) {
      if (this->m_messageSize < uVar2) {
        LogWriteLine("Transmission error.  Message exceeds expected size.");
        goto LAB_0010dc4b;
      }
      std::
      deque<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
      ::push_back((deque<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
                   *)this,this_00);
      local_48._M_ptr = (element_type *)0x0;
      local_48._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::
      __shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ::operator=(&this_00->
                   super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ,&local_48);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
      this->m_messageSize = 0;
    }
  } while( true );
}

Assistant:

void ReceiveQueue::Push(const void * data, size_t bytes)
{
	std::lock_guard<std::mutex> lock(m_mutex);
	const uint8_t * dataBytes = static_cast<const uint8_t *>(data);
	while (bytes)
	{
		// Check to see if this is a new message, and if so, prepare the buffer and write out the header structure
		if (m_messageSize == 0)
		{
			assert(bytes >= sizeof(MessageHeader));
			MessageHeader header;
			memcpy(&header, data, sizeof(MessageHeader));
			if (header.magic != MAGIC_HEADER_VAL)
			{
				LogWriteLine("Transmission error.  Magic header mismatch.");
				return;
			}
			m_messageSize = header.size;
			if (!m_receiveBuffer)
				m_receiveBuffer = CreateBuffer();
			m_receiveBuffer->clear();
			bytes -= sizeof(MessageHeader);
			dataBytes += sizeof(MessageHeader);
		}

		// Don't write out more than the message size yet
		auto bytesToWrite = bytes;
		auto maxBytes = m_messageSize - m_receiveBuffer->size();
		if (bytesToWrite > maxBytes)
			bytesToWrite = maxBytes;

		// Write data into the receive buffer and update our counts
		m_receiveBuffer->insert(m_receiveBuffer->end(), dataBytes, dataBytes + bytesToWrite);
		assert(bytesToWrite <= bytes);
		bytes -= bytesToWrite;
		dataBytes += bytesToWrite;

		if (m_receiveBuffer->size() >= m_messageSize)
		{
			if (m_receiveBuffer->size() > m_messageSize)
			{
				LogWriteLine("Transmission error.  Message exceeds expected size.");
				break;
			}
			else
			{
				m_queue.push(m_receiveBuffer);
			}
			m_receiveBuffer = nullptr;
			m_messageSize = 0;
		}
	}
}